

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * kwssys::SystemTools::AddSpaceBetweenCapitalizedWords
                   (string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  int iVar2;
  char cVar3;
  size_t i;
  ulong uVar4;
  int iVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (s->_M_string_length != 0) {
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    cVar3 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar3);
    for (uVar4 = 1; uVar4 < s->_M_string_length; uVar4 = uVar4 + 1) {
      pcVar1 = (s->_M_dataplus)._M_p;
      iVar2 = isupper((int)pcVar1[uVar4]);
      if (iVar2 != 0) {
        iVar5 = (int)pcVar1[uVar4 - 1];
        iVar2 = isspace(iVar5);
        if (iVar2 == 0) {
          iVar2 = isupper(iVar5);
          if (iVar2 == 0) {
            std::__cxx11::string::push_back(cVar3);
          }
        }
      }
      std::__cxx11::string::push_back(cVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::AddSpaceBetweenCapitalizedWords(const std::string& s)
{
  std::string n;
  if (!s.empty()) {
    n.reserve(s.size());
    n += s[0];
    for (size_t i = 1; i < s.size(); i++) {
      if (isupper(s[i]) && !isspace(s[i - 1]) && !isupper(s[i - 1])) {
        n += ' ';
      }
      n += s[i];
    }
  }
  return n;
}